

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeClassConstants
               (ExpressionContext *ctx,SynBase *source,TypeBase *type,
               IntrusiveList<SynConstant> constants,IntrusiveList<ConstantData> *target)

{
  ModuleData *pMVar1;
  TypeBase *pTVar2;
  bool bVar3;
  int iVar4;
  ExprBase *pEVar5;
  ExprBase *rhs;
  undefined4 extraout_var_00;
  ConstantData *pCVar6;
  char *msg;
  SynConstant *pSVar7;
  ExpressionContext *ctx_00;
  IntrusiveList<ConstantData> *pIVar8;
  InplaceStr name;
  TypeBase *local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  pSVar7 = constants.tail;
  local_40 = type;
  ctx_00 = (ExpressionContext *)constants.head;
  do {
    if (ctx_00 == (ExpressionContext *)0x0) {
      return;
    }
    pMVar1 = (ctx_00->uniqueDependencies).little[3];
    pIVar8 = target;
    if (pMVar1 == (ModuleData *)0x0) {
      bVar3 = ExpressionContext::IsIntegerType(ctx,local_40);
      if ((!bVar3) || (target->head == (ConstantData *)0x0)) {
        msg = "ERROR: only integer constant list gets automatically incremented by 1";
        if (ctx_00 == (ExpressionContext *)constants.head) {
          msg = "ERROR: \'=\' not found after constant name";
        }
        goto LAB_001dbf6a;
      }
      pEVar5 = target->tail->value;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      rhs = (ExprBase *)CONCAT44(extraout_var,iVar4);
      rhs->typeID = 6;
      rhs->source = (SynBase *)ctx_00;
      rhs->type = local_40;
      rhs->next = (ExprBase *)0x0;
      rhs->listed = false;
      rhs->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
      rhs[1]._vptr_ExprBase = (_func_int **)0x1;
      pEVar5 = CreateBinaryOp(ctx,(SynBase *)ctx_00,SYN_BINARY_OP_ADD,pEVar5,rhs);
      pSVar7 = (SynConstant *)0x0;
      pEVar5 = CreateCast(ctx,(SynBase *)ctx_00,pEVar5,local_40,false);
      pEVar5 = anon_unknown.dwarf_ff84f::EvaluateExpression(ctx,source,pEVar5);
      if (pEVar5 == (ExprBase *)0x0) goto LAB_001dbf46;
      msg = "ERROR: expression didn\'t evaluate to a constant number";
      if (pEVar5->typeID != 6) goto LAB_001dbf6a;
LAB_001dbff3:
      while( true ) {
        pCVar6 = pIVar8->head;
        pMVar1 = (ctx_00->uniqueDependencies).little[2];
        if (pCVar6 == (ConstantData *)0x0) break;
        bVar3 = InplaceStr::operator==
                          ((InplaceStr *)&pMVar1->importedFunctionCount,&pCVar6->name->name);
        if (bVar3) {
          pSVar7 = (SynConstant *)(pCVar6->name->name).begin;
          anon_unknown.dwarf_ff84f::Report
                    (ctx,source,"ERROR: name \'%.*s\' is already taken",
                     (ulong)(uint)(*(int *)&(pCVar6->name->name).end - (int)pSVar7));
        }
        pIVar8 = (IntrusiveList<ConstantData> *)&pCVar6->next;
      }
      name.end = (char *)pSVar7;
      name.begin = (char *)pMVar1[1].source;
      anon_unknown.dwarf_ff84f::CheckVariableConflict
                ((anon_unknown_dwarf_ff84f *)ctx,ctx_00,*(SynBase **)&pMVar1->importedFunctionCount,
                 name);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pCVar6 = (ConstantData *)CONCAT44(extraout_var_01,iVar4);
      pCVar6->name = (SynIdentifier *)(ctx_00->uniqueDependencies).little[2];
      pCVar6->value = pEVar5;
      pCVar6->next = (ConstantData *)0x0;
      pCVar6->listed = false;
      IntrusiveList<ConstantData>::push_back(target,pCVar6);
    }
    else {
      pEVar5 = AnalyzeExpression(ctx,(SynBase *)pMVar1);
      pTVar2 = pEVar5->type;
      if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0)) {
        if (local_40 == ctx->typeAuto) {
          local_40 = pTVar2;
        }
        bVar3 = ExpressionContext::IsNumericType(ctx,local_40);
        if (!bVar3) {
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: only basic numeric types can be used as constants");
        }
        pSVar7 = (SynConstant *)0x0;
        pEVar5 = CreateCast(ctx,(SynBase *)ctx_00,pEVar5,local_40,false);
        pEVar5 = anon_unknown.dwarf_ff84f::EvaluateExpression(ctx,source,pEVar5);
        if (pEVar5 == (ExprBase *)0x0) {
LAB_001dbf46:
          msg = "ERROR: expression didn\'t evaluate to a constant number";
        }
        else if (pEVar5->typeID < 8) {
          msg = "ERROR: expression didn\'t evaluate to a constant number";
          if ((0xd8U >> (pEVar5->typeID & 0x1f) & 1) != 0) goto LAB_001dbff3;
        }
        else {
          msg = "ERROR: expression didn\'t evaluate to a constant number";
        }
LAB_001dbf6a:
        anon_unknown.dwarf_ff84f::Report(ctx,source,msg);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        pTVar2 = ctx->typeInt;
        pEVar5->typeID = 6;
        pEVar5->source = (SynBase *)ctx_00;
        pEVar5->type = pTVar2;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
        pEVar5[1]._vptr_ExprBase = (_func_int **)0x0;
        goto LAB_001dbff3;
      }
    }
    ctx_00 = (ExpressionContext *)(ctx_00->uniqueDependencies).little[0];
    if ((ctx_00 == (ExpressionContext *)0x0) ||
       (*(int *)&((InplaceStr *)&ctx_00->code)->begin != 0x3a)) {
      ctx_00 = (ExpressionContext *)0x0;
    }
  } while( true );
}

Assistant:

void AnalyzeClassConstants(ExpressionContext &ctx, SynBase *source, TypeBase *type, IntrusiveList<SynConstant> constants, IntrusiveList<ConstantData> &target)
{
	for(SynConstant *constant = constants.head; constant; constant = getType<SynConstant>(constant->next))
	{
		ExprBase *value = NULL;
			
		if(constant->value)
		{
			value = AnalyzeExpression(ctx, constant->value);

			if(isType<TypeError>(value->type))
				continue;

			if(type == ctx.typeAuto)
				type = value->type;

			if(!ctx.IsNumericType(type))
				Stop(ctx, source, "ERROR: only basic numeric types can be used as constants");

			value = EvaluateExpression(ctx, source, CreateCast(ctx, constant, value, type, false));
		}
		else if(ctx.IsIntegerType(type) && !target.empty())
		{
			value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, CreateCast(ctx, constant, CreateBinaryOp(ctx, constant, SYN_BINARY_OP_ADD, target.tail->value, new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, type, 1)), type, false)));
		}
		else
		{
			if(constant == constants.head)
				Report(ctx, source, "ERROR: '=' not found after constant name");
			else
				Report(ctx, source, "ERROR: only integer constant list gets automatically incremented by 1");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		if(!value || (!isType<ExprBoolLiteral>(value) && !isType<ExprCharacterLiteral>(value) && !isType<ExprIntegerLiteral>(value) && !isType<ExprRationalLiteral>(value)))
		{
			Report(ctx, source, "ERROR: expression didn't evaluate to a constant number");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		for(ConstantData *curr = target.head; curr; curr = curr->next)
		{
			if(constant->name->name == curr->name->name)
				Report(ctx, source, "ERROR: name '%.*s' is already taken", FMT_ISTR(curr->name->name));
		}

		CheckVariableConflict(ctx, constant, constant->name->name);

		target.push_back(new (ctx.get<ConstantData>()) ConstantData(constant->name, value));
	}
}